

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::TryIfSetInst::Exec
          (TryIfSetInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  uint64 *puVar1;
  Char CVar2;
  CharCount CVar3;
  Label LVar4;
  uint uVar5;
  PageAllocation *pPVar6;
  size_t sVar7;
  code *pcVar8;
  undefined4 *puVar9;
  uchar *puVar10;
  bool bVar11;
  
  if (matcher->stats != (Type)0x0) {
    puVar1 = &matcher->stats->numCompares;
    *puVar1 = *puVar1 + 1;
  }
  if (*inputOffset < inputLength) {
    CVar2 = input[*inputOffset];
    if ((ushort)CVar2 < 0x100) {
      bVar11 = ((this->super_SetMixin<false>).set.direct.vec[(ushort)CVar2 >> 5] >>
                ((ushort)CVar2 & 0x1f) & 1) != 0;
    }
    else {
      if ((this->super_SetMixin<false>).set.root == (CharSetNode *)0x0) goto LAB_00f0ef04;
      bVar11 = RuntimeCharSet<char16_t>::Get_helper
                         (&(this->super_SetMixin<false>).set,(uint)(ushort)CVar2);
    }
    if (bVar11 != false) {
      if ((contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
          super_ContinuousPageStack<1UL>.bufferSize -
          (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
          super_ContinuousPageStack<1UL>.nextTop < 0x20) {
        ContinuousPageStack<1UL>::Resize((ContinuousPageStack<1UL> *)contStack,0x20);
      }
      if ((contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
          super_ContinuousPageStack<1UL>.bufferSize == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar11 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                            ,199,"(bufferSize)","bufferSize");
        if (!bVar11) goto LAB_00f0ef81;
        *puVar9 = 0;
      }
      pPVar6 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
               super_ContinuousPageStack<1UL>.pageAllocation;
      sVar7 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
              super_ContinuousPageStack<1UL>.nextTop;
      (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
      super_ContinuousPageStack<1UL>.nextTop = sVar7 + 0x20;
      *(size_t *)((long)&pPVar6[1].pageCount + sVar7) =
           (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
           topElementSize;
      (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
      topElementSize = 0x20;
      CVar3 = *inputOffset;
      LVar4 = (this->super_TryMixin).failLabel;
      *(undefined1 *)((long)&pPVar6[2].pageCount + sVar7) = 0;
      *(undefined ***)((long)&pPVar6[1].segment + sVar7) = &PTR_Print_01559788;
      *(CharCount *)((long)&pPVar6[2].pageCount + sVar7 + 4) = CVar3;
      *(Label *)((long)&pPVar6[2].segment + sVar7) = LVar4;
      Matcher::PushStats(matcher,contStack,input);
      puVar10 = *instPointer + 0x2d;
      goto LAB_00f0ef6c;
    }
  }
LAB_00f0ef04:
  uVar5 = (this->super_TryMixin).failLabel;
  if ((((matcher->program).ptr)->rep).insts.instsLen <= uVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar11 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                        ,0x76d,"(label < program->rep.insts.instsLen)",
                        "label < program->rep.insts.instsLen");
    if (!bVar11) {
LAB_00f0ef81:
      pcVar8 = (code *)invalidInstructionException();
      (*pcVar8)();
    }
    *puVar9 = 0;
  }
  puVar10 = (((matcher->program).ptr)->rep).insts.insts.ptr + uVar5;
LAB_00f0ef6c:
  *instPointer = puVar10;
  return false;
}

Assistant:

inline bool TryIfSetInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif
        if (inputOffset < inputLength && set.Get(input[inputOffset]))
        {
            // CHOICEPOINT: Resume at fail label on backtrack
            PUSH(contStack, ResumeCont, inputOffset, failLabel);
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.PushStats(contStack, input);
#endif
            instPointer += sizeof(*this);
            return false;
        }

        // Proceed directly to exit
        instPointer = matcher.LabelToInstPointer(failLabel);
        return false;
    }